

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  size_t sVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  char *__s;
  int *piVar9;
  stringstream id_list;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Suggested field numbers for ",0x1c);
  uVar7 = (ulong)*(ushort *)(*(long *)(**(long **)this + 0x10) + 2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)(~uVar7 + *(long *)(**(long **)this + 0x10)),
                      uVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  piVar9 = (int *)**(undefined8 **)(this + 8);
  piVar2 = (int *)(*(undefined8 **)(this + 8))[1];
  if (piVar9 != piVar2) {
    __s = "";
    do {
      piVar5 = *(int **)(this + 0x10);
      iVar6 = *piVar5;
      if ((iVar6 < *piVar9) && (0 < **(int **)(this + 0x18))) {
        do {
          if (__s == (char *)0x0) {
            std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
          }
          else {
            sVar4 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar4);
          }
          iVar6 = **(int **)(this + 0x10);
          **(int **)(this + 0x10) = iVar6 + 1;
          std::ostream::operator<<((ostream *)local_1a8,iVar6);
          iVar1 = **(int **)(this + 0x18);
          **(int **)(this + 0x18) = iVar1 + -1;
          piVar5 = *(int **)(this + 0x10);
          iVar6 = *piVar5;
        } while ((iVar6 < *piVar9) && (__s = ", ", 1 < iVar1));
        __s = ", ";
      }
      if (**(int **)(this + 0x18) == 0) break;
      piVar8 = piVar9 + 1;
      if (piVar9[1] <= iVar6) {
        piVar8 = piVar5;
      }
      *piVar5 = *piVar8;
      piVar9 = piVar9 + 2;
    } while (piVar9 != piVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}